

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

void stbi_decode_DXT_color_block(uchar *uncompressed,uchar *compressed)

{
  uint c;
  int iVar1;
  long in_RSI;
  long in_RDI;
  int idx;
  uchar decode_colors [12];
  int c1;
  int c0;
  int b;
  int g;
  int r;
  int i;
  int next_bit;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffc9;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_24;
  undefined1 local_20;
  undefined1 local_1c;
  int local_18;
  int local_14;
  
  local_14 = 0x20;
  c = (uint)*(byte *)(in_RSI + 2) + (uint)*(byte *)(in_RSI + 3) * 0x100;
  stbi_rgb_888_from_565
            (c,(int *)CONCAT17(in_stack_ffffffffffffffcf,
                               CONCAT16(in_stack_ffffffffffffffce,
                                        CONCAT15(in_stack_ffffffffffffffcd,
                                                 CONCAT14(in_stack_ffffffffffffffcc,
                                                          CONCAT13(in_stack_ffffffffffffffcb,
                                                                   CONCAT12(
                                                  in_stack_ffffffffffffffca,
                                                  CONCAT11(in_stack_ffffffffffffffc9,
                                                           in_stack_ffffffffffffffc8))))))),
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  stbi_rgb_888_from_565
            (c,(int *)CONCAT17(in_stack_ffffffffffffffcf,
                               CONCAT16(in_stack_ffffffffffffffce,
                                        CONCAT15(in_stack_ffffffffffffffcd,
                                                 CONCAT14(in_stack_ffffffffffffffcc,
                                                          CONCAT13(in_stack_ffffffffffffffcb,
                                                                   CONCAT12(local_24,CONCAT11(
                                                  local_20,local_1c))))))),
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 4) {
    iVar1 = ((int)(uint)*(byte *)(in_RSI + (local_14 >> 3)) >> ((byte)local_14 & 7) & 3U) * 3;
    local_14 = local_14 + 2;
    *(undefined1 *)(in_RDI + local_18) = (&stack0xffffffffffffffc8)[iVar1];
    *(undefined1 *)(in_RDI + (local_18 + 1)) = (&stack0xffffffffffffffc8)[iVar1 + 1];
    *(undefined1 *)(in_RDI + (local_18 + 2)) = (&stack0xffffffffffffffc8)[iVar1 + 2];
  }
  return;
}

Assistant:

void stbi_decode_DXT_color_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int next_bit = 4*8;
	int i, r, g, b;
	int c0, c1;
	unsigned char decode_colors[4*3];
	//	find the 2 primary colors
	c0 = compressed[0] + (compressed[1] << 8);
	c1 = compressed[2] + (compressed[3] << 8);
	stbi_rgb_888_from_565( c0, &r, &g, &b );
	decode_colors[0] = r;
	decode_colors[1] = g;
	decode_colors[2] = b;
	stbi_rgb_888_from_565( c1, &r, &g, &b );
	decode_colors[3] = r;
	decode_colors[4] = g;
	decode_colors[5] = b;
	//	Like DXT1, but no choicees:
	//	no alpha, 2 interpolated colors
	decode_colors[6] = (2*decode_colors[0] + decode_colors[3]) / 3;
	decode_colors[7] = (2*decode_colors[1] + decode_colors[4]) / 3;
	decode_colors[8] = (2*decode_colors[2] + decode_colors[5]) / 3;
	decode_colors[9] = (decode_colors[0] + 2*decode_colors[3]) / 3;
	decode_colors[10] = (decode_colors[1] + 2*decode_colors[4]) / 3;
	decode_colors[11] = (decode_colors[2] + 2*decode_colors[5]) / 3;
	//	decode the block
	for( i = 0; i < 16*4; i += 4 )
	{
		int idx = ((compressed[next_bit>>3] >> (next_bit & 7)) & 3) * 3;
		next_bit += 2;
		uncompressed[i+0] = decode_colors[idx+0];
		uncompressed[i+1] = decode_colors[idx+1];
		uncompressed[i+2] = decode_colors[idx+2];
	}
	//	done
}